

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::fill<fmt::v8::appender,char>(appender it,size_t n,fill_t<char> *fill)

{
  size_t sVar1;
  char *pcVar2;
  ulong local_48;
  size_t i;
  char *data;
  size_t fill_size;
  fill_t<char> *fill_local;
  size_t n_local;
  appender it_local;
  
  sVar1 = fill_t<char>::size(fill);
  if (sVar1 == 1) {
    pcVar2 = fill_t<char>::operator[](fill,0);
    it_local = fill_n<fmt::v8::appender,unsigned_long,char>(it,n,pcVar2);
  }
  else {
    pcVar2 = fill_t<char>::data(fill);
    n_local = (size_t)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    for (local_48 = 0; local_48 < n; local_48 = local_48 + 1) {
      n_local = (size_t)copy_str<char,char_const*>(pcVar2,pcVar2 + sVar1,(appender)n_local);
    }
    it_local.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)n_local;
  }
  return (appender)
         it_local.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_NOINLINE FMT_CONSTEXPR auto fill(OutputIt it, size_t n,
                                     const fill_t<Char>& fill) -> OutputIt {
  auto fill_size = fill.size();
  if (fill_size == 1) return detail::fill_n(it, n, fill[0]);
  auto data = fill.data();
  for (size_t i = 0; i < n; ++i)
    it = copy_str<Char>(data, data + fill_size, it);
  return it;
}